

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O2

void __thiscall Tree<int>::levelEasyTraversal(Tree<int> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node<int> node;
  queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> myQueue;
  Node<int> local_a8;
  _Deque_base<Node<int>,_std::allocator<Node<int>_>_> local_78;
  
  std::queue<Node<int>,std::deque<Node<int>,std::allocator<Node<int>>>>::
  queue<std::deque<Node<int>,std::allocator<Node<int>>>,void>
            ((queue<Node<int>,_std::deque<Node<int>,_std::allocator<Node<int>_>_>_> *)&local_78);
  iVar1 = (*this->_vptr_Tree[8])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*this->_vptr_Tree[8])(this);
    std::deque<Node<int>,_std::allocator<Node<int>_>_>::push_back
              ((deque<Node<int>,_std::allocator<Node<int>_>_> *)&local_78,
               (value_type *)CONCAT44(extraout_var_00,iVar1));
  }
  while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_a8._vptr_Node = (_func_int **)&PTR_getLeftPoint_00106d58;
    local_a8.rightPoint = (local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->rightPoint;
    local_a8.leftPoint = (local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->leftPoint;
    local_a8.leftValue = (local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->leftValue;
    local_a8._20_4_ =
         *(undefined4 *)&(local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->field_0x14;
    local_a8.dataNode = (local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->dataNode;
    local_a8.rightValue = (local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->rightValue;
    local_a8._36_4_ =
         *(undefined4 *)&(local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->field_0x24;
    std::deque<Node<int>,_std::allocator<Node<int>_>_>::pop_front
              ((deque<Node<int>,_std::allocator<Node<int>_>_> *)&local_78);
    doSomeThing(this,&local_a8);
    if (local_a8.leftPoint != (value_type *)0x0) {
      std::deque<Node<int>,_std::allocator<Node<int>_>_>::push_back
                ((deque<Node<int>,_std::allocator<Node<int>_>_> *)&local_78,local_a8.leftPoint);
    }
    if (local_a8.rightPoint != (value_type *)0x0) {
      std::deque<Node<int>,_std::allocator<Node<int>_>_>::push_back
                ((deque<Node<int>,_std::allocator<Node<int>_>_> *)&local_78,local_a8.rightPoint);
    }
  }
  std::_Deque_base<Node<int>,_std::allocator<Node<int>_>_>::~_Deque_base(&local_78);
  return;
}

Assistant:

virtual void levelEasyTraversal(void){
        //queue of std
        queue< Node<T> >  myQueue;
        if (getRoot() != nullptr){
            myQueue.push(* getRoot()); // this function receive reference var
        }
        while (!myQueue.empty()){
            //get the first node
            Node<T> node = myQueue.front();
            //pop
            myQueue.pop();
            //my business logic, call back
            doSomeThing(&node);
            //deal with children
            if (node.getLeftPoint() != nullptr){
                myQueue.push(* node.getLeftPoint());
            }
            if (node.getRightPoint() != nullptr){
                myQueue.push(* node.getRightPoint());
            }
        }
    }